

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryCase::ProgramBinaryCase
          (ProgramBinaryCase *this,Context *context,char *name,char *desc)

{
  int iVar1;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02139880;
  (this->super_TestCase).m_context = context;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),
             context->m_testCtx->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ProgramBinaryCase_0213a400;
  (this->m_formats).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_formats).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_formats).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ProgramBinaryCase::ProgramBinaryCase (Context& context, const char* name, const char* desc)
		: TestCase			(context, name, desc)
		, CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
{
}